

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

IOTHUB_MESSAGING_RESULT
IoTHubMessaging_LL_Open
          (IOTHUB_MESSAGING_HANDLE messagingHandle,
          IOTHUB_OPEN_COMPLETE_CALLBACK openCompleteCallback,void *userContextCallback)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  SASL_MECHANISM_INTERFACE_DESCRIPTION *sasl_mechanism_interface_description;
  SASL_MECHANISM_HANDLE pSVar4;
  IO_INTERFACE_DESCRIPTION *pIVar5;
  XIO_HANDLE pXVar6;
  CONNECTION_HANDLE pCVar7;
  SESSION_HANDLE pSVar8;
  LINK_HANDLE pLVar9;
  MESSAGE_SENDER_HANDLE pMVar10;
  MESSAGE_RECEIVER_HANDLE pMVar11;
  LOGGER_LOG l_30;
  LOGGER_LOG l_29;
  LOGGER_LOG l_28;
  LOGGER_LOG l_27;
  LOGGER_LOG l_26;
  LOGGER_LOG l_25;
  LOGGER_LOG l_24;
  LOGGER_LOG l_23;
  LOGGER_LOG l_22;
  LOGGER_LOG l_21;
  LOGGER_LOG l_20;
  LOGGER_LOG l_19;
  LOGGER_LOG l_18;
  LOGGER_LOG l_17;
  LOGGER_LOG l_16;
  LOGGER_LOG l_15;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  IO_INTERFACE_DESCRIPTION *saslclientio_interface;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  IO_INTERFACE_DESCRIPTION *tlsio_interface;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  SASL_MECHANISM_INTERFACE_DESCRIPTION *sasl_mechanism_interface;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  AMQP_VALUE receiveTarget;
  AMQP_VALUE receiveSource;
  AMQP_VALUE sendTarget;
  AMQP_VALUE sendSource;
  SASLCLIENTIO_CONFIG sasl_io_config;
  TLSIO_CONFIG tls_io_config;
  char *receive_target_address;
  char *send_target_address;
  IOTHUB_MESSAGING_RESULT result;
  void *userContextCallback_local;
  IOTHUB_OPEN_COMPLETE_CALLBACK openCompleteCallback_local;
  IOTHUB_MESSAGING_HANDLE messagingHandle_local;
  
  receive_target_address = (char *)0x0;
  tls_io_config.invoke_on_send_complete_callback_for_fragments = false;
  tls_io_config._33_7_ = 0;
  sendTarget = (AMQP_VALUE)0x0;
  receiveSource = (AMQP_VALUE)0x0;
  receiveTarget = (AMQP_VALUE)0x0;
  l = (LOGGER_LOG)0x0;
  if (messagingHandle == (IOTHUB_MESSAGING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Open",0x45f,1,"Input parameter cannot be NULL");
    }
    send_target_address._4_4_ = IOTHUB_MESSAGING_INVALID_ARG;
  }
  else if (messagingHandle->isOpened == 0) {
    messagingHandle->message_sender = (MESSAGE_SENDER_HANDLE)0x0;
    messagingHandle->connection = (CONNECTION_HANDLE)0x0;
    messagingHandle->session = (SESSION_HANDLE)0x0;
    messagingHandle->sender_link = (LINK_HANDLE)0x0;
    (messagingHandle->sasl_plain_config).authzid = (char *)0x0;
    messagingHandle->sasl_mechanism_handle = (SASL_MECHANISM_HANDLE)0x0;
    messagingHandle->tls_io = (XIO_HANDLE)0x0;
    messagingHandle->sasl_io = (XIO_HANDLE)0x0;
    receive_target_address = createSendTargetAddress(messagingHandle);
    if (receive_target_address == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"IoTHubMessaging_LL_Open",0x474,1,"Could not create sendTargetAddress");
      }
      send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
    }
    else {
      tls_io_config._32_8_ = createReceiveTargetAddress(messagingHandle);
      if ((char *)tls_io_config._32_8_ == (char *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"IoTHubMessaging_LL_Open",0x479,1,"Could not create receiveTargetAddress");
        }
        send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
      }
      else {
        pcVar3 = createAuthCid(messagingHandle);
        (messagingHandle->sasl_plain_config).authcid = pcVar3;
        if (pcVar3 == (char *)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                      ,"IoTHubMessaging_LL_Open",0x47e,1,"Could not create authCid");
          }
          send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
        }
        else {
          pcVar3 = createSasToken(messagingHandle);
          (messagingHandle->sasl_plain_config).passwd = pcVar3;
          if (pcVar3 == (char *)0x0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                        ,"IoTHubMessaging_LL_Open",0x483,1,"Could not create sasToken");
            }
            send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
          }
          else {
            sasl_mechanism_interface_description = saslplain_get_interface();
            if (sasl_mechanism_interface_description == (SASL_MECHANISM_INTERFACE_DESCRIPTION *)0x0)
            {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                          ,"IoTHubMessaging_LL_Open",0x48c,1,
                          "Could not get SASL plain mechanism interface.");
              }
              send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
            }
            else {
              pSVar4 = saslmechanism_create
                                 (sasl_mechanism_interface_description,
                                  &messagingHandle->sasl_plain_config);
              messagingHandle->sasl_mechanism_handle = pSVar4;
              if (pSVar4 == (SASL_MECHANISM_HANDLE)0x0) {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                            ,"IoTHubMessaging_LL_Open",0x491,1,
                            "Could not create SASL plain mechanism.");
                }
                send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
              }
              else {
                sasl_io_config.sasl_mechanism = (SASL_MECHANISM_HANDLE)messagingHandle->hostname;
                pIVar5 = platform_get_default_tlsio();
                if (pIVar5 == (IO_INTERFACE_DESCRIPTION *)0x0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                              ,"IoTHubMessaging_LL_Open",0x49f,1,
                              "Could not get default TLS IO interface.");
                  }
                  send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                }
                else {
                  pXVar6 = xio_create(pIVar5,&sasl_io_config.sasl_mechanism);
                  messagingHandle->tls_io = pXVar6;
                  if (pXVar6 == (XIO_HANDLE)0x0) {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                ,"IoTHubMessaging_LL_Open",0x4a4,1,"Could not create TLS IO.");
                    }
                    send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                  }
                  else if ((messagingHandle->trusted_cert == (char *)0x0) ||
                          (iVar1 = xio_setoption(messagingHandle->tls_io,"TrustedCerts",
                                                 messagingHandle->trusted_cert), iVar1 == 0)) {
                    (messagingHandle->callback_data).openCompleteCompleteCallback =
                         openCompleteCallback;
                    (messagingHandle->callback_data).openUserContext = userContextCallback;
                    sasl_io_config.underlying_io =
                         (XIO_HANDLE)messagingHandle->sasl_mechanism_handle;
                    sendSource = (AMQP_VALUE)messagingHandle->tls_io;
                    pIVar5 = saslclientio_get_interface_description();
                    if (pIVar5 == (IO_INTERFACE_DESCRIPTION *)0x0) {
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        (*p_Var2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                  ,"IoTHubMessaging_LL_Open",0x4ba,1,
                                  "Could not create get SASL IO interface description.");
                      }
                      send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                    }
                    else {
                      pXVar6 = xio_create(pIVar5,&sendSource);
                      messagingHandle->sasl_io = pXVar6;
                      if (pXVar6 == (XIO_HANDLE)0x0) {
                        p_Var2 = xlogging_get_log_function();
                        if (p_Var2 != (LOGGER_LOG)0x0) {
                          (*p_Var2)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                    ,"IoTHubMessaging_LL_Open",0x4bf,1,"Could not create SASL IO.");
                        }
                        send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                      }
                      else {
                        pCVar7 = connection_create(messagingHandle->sasl_io,
                                                   messagingHandle->hostname,"some",
                                                   (ON_NEW_ENDPOINT)0x0,(void *)0x0);
                        messagingHandle->connection = pCVar7;
                        if (pCVar7 == (CONNECTION_HANDLE)0x0) {
                          p_Var2 = xlogging_get_log_function();
                          if (p_Var2 != (LOGGER_LOG)0x0) {
                            (*p_Var2)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                      ,"IoTHubMessaging_LL_Open",0x4c4,1,
                                      "Could not create connection.");
                          }
                          send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                        }
                        else {
                          pSVar8 = session_create(messagingHandle->connection,(ON_LINK_ATTACHED)0x0,
                                                  (void *)0x0);
                          messagingHandle->session = pSVar8;
                          if (pSVar8 == (SESSION_HANDLE)0x0) {
                            p_Var2 = xlogging_get_log_function();
                            if (p_Var2 != (LOGGER_LOG)0x0) {
                              (*p_Var2)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                        ,"IoTHubMessaging_LL_Open",0x4c9,1,
                                        "Could not create session.");
                            }
                            send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                          }
                          else {
                            iVar1 = session_set_incoming_window(messagingHandle->session,0x7fffffff)
                            ;
                            if (iVar1 == 0) {
                              iVar1 = session_set_outgoing_window(messagingHandle->session,0x3fc00);
                              if (iVar1 == 0) {
                                sendTarget = messaging_create_source("ingress");
                                if (sendTarget == (AMQP_VALUE)0x0) {
                                  p_Var2 = xlogging_get_log_function();
                                  if (p_Var2 != (LOGGER_LOG)0x0) {
                                    (*p_Var2)(AZ_LOG_ERROR,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                              ,"IoTHubMessaging_LL_Open",0x4d8,1,
                                              "Could not create source for link.");
                                  }
                                  send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                                }
                                else {
                                  receiveSource = messaging_create_target(receive_target_address);
                                  if (receiveSource == (AMQP_VALUE)0x0) {
                                    p_Var2 = xlogging_get_log_function();
                                    if (p_Var2 != (LOGGER_LOG)0x0) {
                                      (*p_Var2)(AZ_LOG_ERROR,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                ,"IoTHubMessaging_LL_Open",0x4dd,1,
                                                "Could not create target for link.");
                                    }
                                    send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                                  }
                                  else {
                                    pLVar9 = link_create(messagingHandle->session,"sender-link",
                                                         false,sendTarget,receiveSource);
                                    messagingHandle->sender_link = pLVar9;
                                    if (pLVar9 == (LINK_HANDLE)0x0) {
                                      p_Var2 = xlogging_get_log_function();
                                      if (p_Var2 != (LOGGER_LOG)0x0) {
                                        (*p_Var2)(AZ_LOG_ERROR,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                  ,"IoTHubMessaging_LL_Open",0x4e2,1,
                                                  "Could not create link.");
                                      }
                                      send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                                    }
                                    else {
                                      iVar1 = attachServiceClientTypeToLink
                                                        (messagingHandle->sender_link);
                                      if (iVar1 == 0) {
                                        iVar1 = link_set_snd_settle_mode
                                                          (messagingHandle->sender_link,'\0');
                                        if (iVar1 == 0) {
                                          pMVar10 = messagesender_create
                                                              (messagingHandle->sender_link,
                                                               IoTHubMessaging_LL_SenderStateChanged
                                                               ,messagingHandle);
                                          messagingHandle->message_sender = pMVar10;
                                          if (pMVar10 == (MESSAGE_SENDER_HANDLE)0x0) {
                                            p_Var2 = xlogging_get_log_function();
                                            if (p_Var2 != (LOGGER_LOG)0x0) {
                                              (*p_Var2)(AZ_LOG_ERROR,
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                  ,"IoTHubMessaging_LL_Open",0x4f1,1,
                                                  "Could not create message sender.");
                                            }
                                            send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                                          }
                                          else {
                                            iVar1 = messagesender_open(messagingHandle->
                                                                       message_sender);
                                            if (iVar1 == 0) {
                                              receiveTarget =
                                                   messaging_create_source
                                                             ((char *)tls_io_config._32_8_);
                                              if (receiveTarget == (AMQP_VALUE)0x0) {
                                                p_Var2 = xlogging_get_log_function();
                                                if (p_Var2 != (LOGGER_LOG)0x0) {
                                                  (*p_Var2)(AZ_LOG_ERROR,
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                  ,"IoTHubMessaging_LL_Open",0x4fb,1,
                                                  "Could not create source for link.");
                                                }
                                                send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                                              }
                                              else {
                                                l = (LOGGER_LOG)
                                                    messaging_create_target("receiver_001");
                                                if ((AMQP_VALUE)l == (AMQP_VALUE)0x0) {
                                                  p_Var2 = xlogging_get_log_function();
                                                  if (p_Var2 != (LOGGER_LOG)0x0) {
                                                    (*p_Var2)(AZ_LOG_ERROR,
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                  ,"IoTHubMessaging_LL_Open",0x500,1,
                                                  "Could not create target for link.");
                                                  }
                                                  send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR
                                                  ;
                                                }
                                                else {
                                                  pLVar9 = link_create(messagingHandle->session,
                                                                       "receiver-link",true,
                                                                       receiveTarget,(AMQP_VALUE)l);
                                                  messagingHandle->receiver_link = pLVar9;
                                                  if (pLVar9 == (LINK_HANDLE)0x0) {
                                                    p_Var2 = xlogging_get_log_function();
                                                    if (p_Var2 != (LOGGER_LOG)0x0) {
                                                      (*p_Var2)(AZ_LOG_ERROR,
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                  ,"IoTHubMessaging_LL_Open",0x505,1,
                                                  "Could not create link.");
                                                  }
                                                  send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = attachServiceClientTypeToLink
                                                                      (messagingHandle->
                                                                       receiver_link);
                                                    if (iVar1 == 0) {
                                                      iVar1 = link_set_rcv_settle_mode
                                                                        (messagingHandle->
                                                                         receiver_link,'\0');
                                                      if (iVar1 == 0) {
                                                        pMVar11 = messagereceiver_create
                                                                            (messagingHandle->
                                                                             receiver_link,
                                                                                                                                                          
                                                  IoTHubMessaging_LL_ReceiverStateChanged,
                                                  messagingHandle);
                                                  messagingHandle->message_receiver = pMVar11;
                                                  if (pMVar11 == (MESSAGE_RECEIVER_HANDLE)0x0) {
                                                    p_Var2 = xlogging_get_log_function();
                                                    if (p_Var2 != (LOGGER_LOG)0x0) {
                                                      (*p_Var2)(AZ_LOG_ERROR,
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                  ,"IoTHubMessaging_LL_Open",0x514,1,
                                                  "Could not create message receiver.");
                                                  }
                                                  send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = messagereceiver_open
                                                                      (messagingHandle->
                                                                       message_receiver,
                                                                                                                                              
                                                  IoTHubMessaging_LL_FeedbackMessageReceived,
                                                  messagingHandle);
                                                  if (iVar1 == 0) {
                                                    messagingHandle->isOpened = 1;
                                                    send_target_address._4_4_ = IOTHUB_MESSAGING_OK;
                                                  }
                                                  else {
                                                    p_Var2 = xlogging_get_log_function();
                                                    if (p_Var2 != (LOGGER_LOG)0x0) {
                                                      (*p_Var2)(AZ_LOG_ERROR,
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                  ,"IoTHubMessaging_LL_Open",0x519,1,
                                                  "Could not open the message receiver.");
                                                  }
                                                  messagereceiver_destroy
                                                            (messagingHandle->message_receiver);
                                                  messagingHandle->message_receiver =
                                                       (MESSAGE_RECEIVER_HANDLE)0x0;
                                                  send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR
                                                  ;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    p_Var2 = xlogging_get_log_function();
                                                    if (p_Var2 != (LOGGER_LOG)0x0) {
                                                      (*p_Var2)(AZ_LOG_ERROR,
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                  ,"IoTHubMessaging_LL_Open",0x50f,1,
                                                  "Could not set the sender settle mode.");
                                                  }
                                                  send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    p_Var2 = xlogging_get_log_function();
                                                    if (p_Var2 != (LOGGER_LOG)0x0) {
                                                      (*p_Var2)(AZ_LOG_ERROR,
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                  ,"IoTHubMessaging_LL_Open",0x50a,1,
                                                  "Could not create link.");
                                                  }
                                                  send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR
                                                  ;
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                            else {
                                              p_Var2 = xlogging_get_log_function();
                                              if (p_Var2 != (LOGGER_LOG)0x0) {
                                                (*p_Var2)(AZ_LOG_ERROR,
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                  ,"IoTHubMessaging_LL_Open",0x4f6,1,
                                                  "Could not open the message sender.");
                                              }
                                              send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                                            }
                                          }
                                        }
                                        else {
                                          p_Var2 = xlogging_get_log_function();
                                          if (p_Var2 != (LOGGER_LOG)0x0) {
                                            (*p_Var2)(AZ_LOG_ERROR,
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                  ,"IoTHubMessaging_LL_Open",0x4ec,1,
                                                  "Could not set the sender settle mode.");
                                          }
                                          send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                                        }
                                      }
                                      else {
                                        p_Var2 = xlogging_get_log_function();
                                        if (p_Var2 != (LOGGER_LOG)0x0) {
                                          (*p_Var2)(AZ_LOG_ERROR,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                  ,"IoTHubMessaging_LL_Open",0x4e7,1,
                                                  "Could not set the sender attach properties.");
                                        }
                                        send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                                      }
                                    }
                                  }
                                }
                              }
                              else {
                                p_Var2 = xlogging_get_log_function();
                                if (p_Var2 != (LOGGER_LOG)0x0) {
                                  (*p_Var2)(AZ_LOG_ERROR,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                            ,"IoTHubMessaging_LL_Open",0x4d3,1,
                                            "Could not set outgoing window.");
                                }
                                send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                              }
                            }
                            else {
                              p_Var2 = xlogging_get_log_function();
                              if (p_Var2 != (LOGGER_LOG)0x0) {
                                (*p_Var2)(AZ_LOG_ERROR,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                          ,"IoTHubMessaging_LL_Open",0x4ce,1,
                                          "Could not set incoming window.");
                              }
                              send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                ,"IoTHubMessaging_LL_Open",0x4a9,1,
                                "Could set tlsio trusted certificate.");
                    }
                    xio_destroy(messagingHandle->tls_io);
                    messagingHandle->tls_io = (XIO_HANDLE)0x0;
                    send_target_address._4_4_ = IOTHUB_MESSAGING_ERROR;
                  }
                }
              }
            }
            if (send_target_address._4_4_ != IOTHUB_MESSAGING_OK) {
              if (messagingHandle->message_sender != (MESSAGE_SENDER_HANDLE)0x0) {
                messagesender_destroy(messagingHandle->message_sender);
                messagingHandle->message_sender = (MESSAGE_SENDER_HANDLE)0x0;
              }
              if (messagingHandle->tls_io != (XIO_HANDLE)0x0) {
                xio_destroy(messagingHandle->tls_io);
                messagingHandle->tls_io = (XIO_HANDLE)0x0;
              }
              if (messagingHandle->sasl_io != (XIO_HANDLE)0x0) {
                xio_destroy(messagingHandle->sasl_io);
                messagingHandle->sasl_io = (XIO_HANDLE)0x0;
              }
              if (messagingHandle->session != (SESSION_HANDLE)0x0) {
                session_destroy(messagingHandle->session);
                messagingHandle->session = (SESSION_HANDLE)0x0;
              }
              if (messagingHandle->connection != (CONNECTION_HANDLE)0x0) {
                connection_destroy(messagingHandle->connection);
                messagingHandle->connection = (CONNECTION_HANDLE)0x0;
              }
              if (messagingHandle->receiver_link != (LINK_HANDLE)0x0) {
                link_destroy(messagingHandle->receiver_link);
                messagingHandle->receiver_link = (LINK_HANDLE)0x0;
              }
            }
          }
        }
      }
    }
    if (send_target_address._4_4_ != IOTHUB_MESSAGING_OK) {
      if ((messagingHandle->sasl_plain_config).authcid != (char *)0x0) {
        free((messagingHandle->sasl_plain_config).authcid);
        (messagingHandle->sasl_plain_config).authcid = (char *)0x0;
      }
      if ((messagingHandle->sasl_plain_config).passwd != (char *)0x0) {
        free((messagingHandle->sasl_plain_config).passwd);
        (messagingHandle->sasl_plain_config).passwd = (char *)0x0;
      }
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Open",0x464,1,"Messaging is already opened");
    }
    send_target_address._4_4_ = IOTHUB_MESSAGING_OK;
  }
  amqpvalue_destroy(sendTarget);
  amqpvalue_destroy(receiveSource);
  amqpvalue_destroy(receiveTarget);
  amqpvalue_destroy((AMQP_VALUE)l);
  if (receive_target_address != (char *)0x0) {
    free(receive_target_address);
  }
  if (tls_io_config._32_8_ != 0) {
    free((void *)tls_io_config._32_8_);
  }
  return send_target_address._4_4_;
}

Assistant:

IOTHUB_MESSAGING_RESULT IoTHubMessaging_LL_Open(IOTHUB_MESSAGING_HANDLE messagingHandle, IOTHUB_OPEN_COMPLETE_CALLBACK openCompleteCallback, void* userContextCallback)
{
    IOTHUB_MESSAGING_RESULT result;

    char* send_target_address = NULL;
    char* receive_target_address = NULL;

    TLSIO_CONFIG tls_io_config;
    SASLCLIENTIO_CONFIG sasl_io_config;

    AMQP_VALUE sendSource = NULL;
    AMQP_VALUE sendTarget = NULL;

    AMQP_VALUE receiveSource = NULL;
    AMQP_VALUE receiveTarget = NULL;

    if (messagingHandle == NULL)
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else if (messagingHandle->isOpened != 0)
    {
        LogError("Messaging is already opened");
        result = IOTHUB_MESSAGING_OK;
    }
    else
    {
        messagingHandle->message_sender = NULL;
        messagingHandle->connection = NULL;
        messagingHandle->session = NULL;
        messagingHandle->sender_link = NULL;
        messagingHandle->sasl_plain_config.authzid = NULL;
        messagingHandle->sasl_mechanism_handle = NULL;
        messagingHandle->tls_io = NULL;
        messagingHandle->sasl_io = NULL;

        if ((send_target_address = createSendTargetAddress(messagingHandle)) == NULL)
        {
            LogError("Could not create sendTargetAddress");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else if ((receive_target_address = createReceiveTargetAddress(messagingHandle)) == NULL)
        {
            LogError("Could not create receiveTargetAddress");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else if ((messagingHandle->sasl_plain_config.authcid = createAuthCid(messagingHandle)) == NULL)
        {
            LogError("Could not create authCid");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else if ((messagingHandle->sasl_plain_config.passwd = createSasToken(messagingHandle)) == NULL)
        {
            LogError("Could not create sasToken");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else
        {
            const SASL_MECHANISM_INTERFACE_DESCRIPTION* sasl_mechanism_interface;

            if ((sasl_mechanism_interface = saslplain_get_interface()) == NULL)
            {
                LogError("Could not get SASL plain mechanism interface.");
                result = IOTHUB_MESSAGING_ERROR;
            }
            else if ((messagingHandle->sasl_mechanism_handle = saslmechanism_create(sasl_mechanism_interface, &messagingHandle->sasl_plain_config)) == NULL)
            {
                LogError("Could not create SASL plain mechanism.");
                result = IOTHUB_MESSAGING_ERROR;
            }
            else
            {
                tls_io_config.hostname = messagingHandle->hostname;
                tls_io_config.port = 5671;
                tls_io_config.underlying_io_interface = NULL;
                tls_io_config.underlying_io_parameters = NULL;

                const IO_INTERFACE_DESCRIPTION* tlsio_interface;

                if ((tlsio_interface = platform_get_default_tlsio()) == NULL)
                {
                    LogError("Could not get default TLS IO interface.");
                    result = IOTHUB_MESSAGING_ERROR;
                }
                else if ((messagingHandle->tls_io = xio_create(tlsio_interface, &tls_io_config)) == NULL)
                {
                    LogError("Could not create TLS IO.");
                    result = IOTHUB_MESSAGING_ERROR;
                }
                else if (messagingHandle->trusted_cert != NULL && xio_setoption(messagingHandle->tls_io, OPTION_TRUSTED_CERT, messagingHandle->trusted_cert) != 0)
                {
                    LogError("Could set tlsio trusted certificate.");
                    xio_destroy(messagingHandle->tls_io);
                    messagingHandle->tls_io = NULL;
                    result = IOTHUB_MESSAGING_ERROR;
                }
                else
                {
                    messagingHandle->callback_data.openCompleteCompleteCallback = openCompleteCallback;
                    messagingHandle->callback_data.openUserContext = userContextCallback;

                    sasl_io_config.sasl_mechanism = messagingHandle->sasl_mechanism_handle;
                    sasl_io_config.underlying_io = messagingHandle->tls_io;

                    const IO_INTERFACE_DESCRIPTION* saslclientio_interface;

                    if ((saslclientio_interface = saslclientio_get_interface_description()) == NULL)
                    {
                        LogError("Could not create get SASL IO interface description.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->sasl_io = xio_create(saslclientio_interface, &sasl_io_config)) == NULL)
                    {
                        LogError("Could not create SASL IO.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->connection = connection_create(messagingHandle->sasl_io, messagingHandle->hostname, "some", NULL, NULL)) == NULL)
                    {
                        LogError("Could not create connection.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->session = session_create(messagingHandle->connection, NULL, NULL)) == NULL)
                    {
                        LogError("Could not create session.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (session_set_incoming_window(messagingHandle->session, 2147483647) != 0)
                    {
                        LogError("Could not set incoming window.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (session_set_outgoing_window(messagingHandle->session, 255 * 1024) != 0)
                    {
                        LogError("Could not set outgoing window.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((sendSource = messaging_create_source("ingress")) == NULL)
                    {
                        LogError("Could not create source for link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((sendTarget = messaging_create_target(send_target_address)) == NULL)
                    {
                        LogError("Could not create target for link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->sender_link = link_create(messagingHandle->session, "sender-link", role_sender, sendSource, sendTarget)) == NULL)
                    {
                        LogError("Could not create link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (attachServiceClientTypeToLink(messagingHandle->sender_link) != 0)
                    {
                        LogError("Could not set the sender attach properties.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (link_set_snd_settle_mode(messagingHandle->sender_link, sender_settle_mode_unsettled) != 0)
                    {
                        LogError("Could not set the sender settle mode.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->message_sender = messagesender_create(messagingHandle->sender_link, IoTHubMessaging_LL_SenderStateChanged, messagingHandle)) == NULL)
                    {
                        LogError("Could not create message sender.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (messagesender_open(messagingHandle->message_sender) != 0)
                    {
                        LogError("Could not open the message sender.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((receiveSource = messaging_create_source(receive_target_address)) == NULL)
                    {
                        LogError("Could not create source for link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((receiveTarget = messaging_create_target("receiver_001")) == NULL)
                    {
                        LogError("Could not create target for link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->receiver_link = link_create(messagingHandle->session, "receiver-link", role_receiver, receiveSource, receiveTarget)) == NULL)
                    {
                        LogError("Could not create link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (attachServiceClientTypeToLink(messagingHandle->receiver_link) != 0)
                    {
                        LogError("Could not create link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (link_set_rcv_settle_mode(messagingHandle->receiver_link, receiver_settle_mode_first) != 0)
                    {
                        LogError("Could not set the sender settle mode.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->message_receiver = messagereceiver_create(messagingHandle->receiver_link, IoTHubMessaging_LL_ReceiverStateChanged, messagingHandle)) == NULL)
                    {
                        LogError("Could not create message receiver.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (messagereceiver_open(messagingHandle->message_receiver, IoTHubMessaging_LL_FeedbackMessageReceived, messagingHandle) != 0)
                    {
                        LogError("Could not open the message receiver.");
                        messagereceiver_destroy(messagingHandle->message_receiver);
                        messagingHandle->message_receiver = NULL;
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else
                    {
                        messagingHandle->isOpened = true;
                        result = IOTHUB_MESSAGING_OK;
                    }
                }
            }
            if (result != IOTHUB_MESSAGING_OK)
            {
                if (messagingHandle->message_sender != NULL)
                {
                    messagesender_destroy(messagingHandle->message_sender);
                    messagingHandle->message_sender = NULL;
                }
                if (messagingHandle->tls_io != NULL)
                {
                    xio_destroy(messagingHandle->tls_io);
                    messagingHandle->tls_io = NULL;
                }
                if (messagingHandle->sasl_io != NULL)
                {
                    xio_destroy(messagingHandle->sasl_io);
                    messagingHandle->sasl_io = NULL;
                }
                if (messagingHandle->session != NULL)
                {
                    session_destroy(messagingHandle->session);
                    messagingHandle->session = NULL;
                }
                if (messagingHandle->connection != NULL)
                {
                    connection_destroy(messagingHandle->connection);
                    messagingHandle->connection = NULL;
                }
                if (messagingHandle->receiver_link != NULL)
                {
                    link_destroy(messagingHandle->receiver_link);
                    messagingHandle->receiver_link = NULL;
                }
            }
        }
        if (result != IOTHUB_MESSAGING_OK)
        {
            if (messagingHandle->sasl_plain_config.authcid != NULL)
            {
                free((char*)messagingHandle->sasl_plain_config.authcid);
                messagingHandle->sasl_plain_config.authcid = NULL;
            }
            if (messagingHandle->sasl_plain_config.passwd != NULL)
            {
                free((char*)messagingHandle->sasl_plain_config.passwd);
                messagingHandle->sasl_plain_config.passwd = NULL;
            }
        }
    }
    amqpvalue_destroy(sendSource);
    amqpvalue_destroy(sendTarget);
    amqpvalue_destroy(receiveSource);
    amqpvalue_destroy(receiveTarget);

    if (send_target_address != NULL)
    {
        free(send_target_address);
    }
    if (receive_target_address != NULL)
    {
        free(receive_target_address);
    }
    return result;
}